

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

uint32_t __thiscall spirv_cross::ParsedIR::increase_bound_by(ParsedIR *this,uint32_t incr_amount)

{
  size_t sVar1;
  pointer local_38;
  uint local_2c;
  size_t sStack_28;
  uint32_t i;
  size_t new_bound;
  size_t curr_bound;
  ParsedIR *pPStack_10;
  uint32_t incr_amount_local;
  ParsedIR *this_local;
  
  curr_bound._4_4_ = incr_amount;
  pPStack_10 = this;
  new_bound = VectorView<spirv_cross::Variant>::size
                        (&(this->ids).super_VectorView<spirv_cross::Variant>);
  sStack_28 = new_bound + curr_bound._4_4_;
  sVar1 = VectorView<spirv_cross::Variant>::size
                    (&(this->ids).super_VectorView<spirv_cross::Variant>);
  SmallVector<spirv_cross::Variant,_8UL>::reserve(&this->ids,sVar1 + curr_bound._4_4_);
  for (local_2c = 0; local_2c < curr_bound._4_4_; local_2c = local_2c + 1) {
    local_38 = ::std::
               unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               ::get(&this->pool_group);
    SmallVector<spirv_cross::Variant,8ul>::emplace_back<spirv_cross::ObjectPoolGroup*>
              ((SmallVector<spirv_cross::Variant,8ul> *)&this->ids,&local_38);
  }
  SmallVector<unsigned_char,_8UL>::resize(&this->block_meta,sStack_28);
  return (uint32_t)new_bound;
}

Assistant:

uint32_t ParsedIR::increase_bound_by(uint32_t incr_amount)
{
	auto curr_bound = ids.size();
	auto new_bound = curr_bound + incr_amount;

	ids.reserve(ids.size() + incr_amount);
	for (uint32_t i = 0; i < incr_amount; i++)
		ids.emplace_back(pool_group.get());

	block_meta.resize(new_bound);
	return uint32_t(curr_bound);
}